

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O2

void __thiscall
bwtil::IndexedBWT::IndexedBWT(IndexedBWT *this,string *BWT,ulint sample_rate,bool verbose)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uchar uVar2;
  undefined1 auVar3 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  byte bVar5;
  uint i_4;
  int iVar6;
  uint uVar7;
  ulint uVar8;
  ostream *poVar9;
  char *pcVar10;
  byte *pbVar11;
  undefined1 *puVar12;
  reference pvVar13;
  uchar *puVar14;
  pointer puVar15;
  long lVar16;
  ulint i;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 in_XMM1 [16];
  reference rVar19;
  allocator_type local_129;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet;
  vector<bool,_std::allocator<bool>_> mark_pos;
  succinct_bitvector local_b8;
  vector<bool,_std::allocator<bool>_> char_inserted;
  undefined1 extraout_var [56];
  
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->marked_positions).n = 0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->marked_positions).bitvector.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&(this->marked_positions).global_rank1 + 2) = 0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->text_pointers)._size = 0;
  (this->text_pointers)._width = 0;
  (this->text_pointers)._field_mask = 0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar17 = BWT->_M_string_length;
  this->n = uVar17;
  this->offrate = sample_rate;
  if (sample_rate == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = uVar17 / sample_rate + 1;
  }
  pvVar1 = &this->inverse_remapping;
  this->number_of_SA_pointers = uVar8;
  local_120 = &this->FIRST;
  local_128 = &this->remapping;
  if (verbose) {
    poVar9 = std::operator<<((ostream *)&std::cout," Building indexed BWT data structure");
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"  Number of sampled SA pointers = ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    uVar17 = this->n;
  }
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar17);
  auVar18._0_8_ = log2(auVar3._0_8_);
  auVar18._8_56_ = extraout_var;
  auVar3 = vroundsd_avx(auVar18._0_16_,auVar18._0_16_,10);
  iVar6 = vcvttsd2usi_avx512f(auVar3);
  this->w = iVar6 + (uint)(iVar6 == 0);
  char_inserted.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,0x100,
             (value_type_conflict2 *)&char_inserted,(allocator_type *)&mark_pos);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_128,&local_b8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.n = local_b8.n & 0xffffffffffffff00;
  alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&char_inserted,0x100,(bool *)&local_b8,(allocator_type *)&mark_pos);
  lVar16 = 0;
  for (uVar17 = 0; uVar17 < this->n; uVar17 = uVar17 + 1) {
    pcVar10 = (char *)std::__cxx11::string::at((ulong)BWT);
    if (*pcVar10 == '\0') {
      this->terminator_position = uVar17;
      lVar16 = lVar16 + 1;
    }
    else {
      pbVar11 = (byte *)std::__cxx11::string::at((ulong)BWT);
      rVar19 = std::vector<bool,_std::allocator<bool>_>::at(&char_inserted,(ulong)*pbVar11);
      if ((*rVar19._M_p & rVar19._M_mask) == 0) {
        puVar12 = (undefined1 *)std::__cxx11::string::at((ulong)BWT);
        local_b8.n = CONCAT71(local_b8.n._1_7_,*puVar12);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&alphabet,(uchar *)&local_b8);
        pbVar11 = (byte *)std::__cxx11::string::at((ulong)BWT);
        rVar19 = std::vector<bool,_std::allocator<bool>_>::at(&char_inserted,(ulong)*pbVar11);
        *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
      }
    }
  }
  if (lVar16 == 1) {
    this->sigma = (int)alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                  (int)alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    for (uVar7 = 0;
        (ulong)uVar7 <
        (ulong)((long)alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start); uVar7 = uVar7 + 1) {
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          (&alphabet,(ulong)uVar7);
      (local_128->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[*pbVar11] = (uchar)uVar7;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,(ulong)this->sigma
               ,(allocator_type *)&mark_pos);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar1,&local_b8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
    for (uVar17 = 0; uVar17 < this->sigma; uVar17 = uVar17 + 1) {
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&alphabet,uVar17);
      (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar17] = *pvVar13;
    }
    for (uVar17 = 0; uVar17 < this->n; uVar17 = uVar17 + 1) {
      pbVar11 = (byte *)std::__cxx11::string::at((ulong)BWT);
      uVar2 = (local_128->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
              .super__Vector_impl_data._M_start[*pbVar11];
      puVar14 = (uchar *)std::__cxx11::string::at((ulong)BWT);
      *puVar14 = uVar2;
    }
    WaveletTree::WaveletTree((WaveletTree *)&local_b8,BWT,verbose);
    WaveletTree::operator=(&this->bwt_wt,(WaveletTree *)&local_b8);
    std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
              ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
               &local_b8.bitvector);
    local_b8.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_finish._0_2_ = 0;
    local_b8.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._10_8_ = 0;
    local_b8._74_8_ = 0;
    local_b8._82_8_ = 0;
    local_b8.n = 0;
    local_b8.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
    local_b8.bitvector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_2_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._2_6_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish._0_2_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish._2_6_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
    local_b8.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
    local_b8.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_start._0_2_ = 0;
    local_b8.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_start._2_6_ = 0;
    succinct_bitvector::operator=(&this->marked_positions,&local_b8);
    succinct_bitvector::~succinct_bitvector(&local_b8);
    bv::internal::packed_view<std::vector>::packed_view
              ((packed_view<std::vector> *)&local_b8,(ulong)this->w,this->number_of_SA_pointers);
    bv::internal::packed_view<std::vector>::operator=
              (&this->text_pointers,(packed_view<std::vector> *)&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
    this->log_sigma = (this->bwt_wt).log_sigma;
    mark_pos.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,0x100,
               (value_type *)&mark_pos,&local_129);
    pvVar4 = local_120;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_120,&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
    puVar15 = (pvVar4->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar15[0xff] = 0;
    for (uVar17 = 0; uVar17 < this->n; uVar17 = uVar17 + 1) {
      if (uVar17 != this->terminator_position) {
        bVar5 = WaveletTree::charAt(&this->bwt_wt,uVar17);
        puVar15 = (local_120->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar15[bVar5] = puVar15[bVar5] + 1;
      }
    }
    for (lVar16 = 1; lVar16 != 0xff; lVar16 = lVar16 + 1) {
      puVar15[lVar16] = puVar15[lVar16] + puVar15[lVar16 + -1];
    }
    for (lVar16 = 0x7f0; lVar16 != 0; lVar16 = lVar16 + -8) {
      *(undefined8 *)((long)puVar15 + lVar16) = *(undefined8 *)((long)puVar15 + lVar16 + -8);
    }
    *puVar15 = 0;
    for (lVar16 = 0; lVar16 != 0xff; lVar16 = lVar16 + 1) {
      puVar15[lVar16] = puVar15[lVar16] + 1;
    }
    for (uVar17 = 0; uVar17 < this->n; uVar17 = uVar17 + 1) {
      pbVar11 = (byte *)std::__cxx11::string::at((ulong)BWT);
      uVar2 = (pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[*pbVar11];
      puVar14 = (uchar *)std::__cxx11::string::at((ulong)BWT);
      *puVar14 = uVar2;
    }
    puVar12 = (undefined1 *)std::__cxx11::string::at((ulong)BWT);
    *puVar12 = 0;
    if (sample_rate != 0) {
      if (verbose) {
        std::operator<<((ostream *)&std::cout,"\n  Marking positions containing a SA pointer ... ");
      }
      markPositions(&mark_pos,this,verbose);
      succinct_bitvector::succinct_bitvector(&local_b8,&mark_pos);
      succinct_bitvector::operator=(&this->marked_positions,&local_b8);
      succinct_bitvector::~succinct_bitvector(&local_b8);
      if (verbose) {
        std::operator<<((ostream *)&std::cout,"  Done.\n");
        std::operator<<((ostream *)&std::cout,"\n  Sampling SA pointers ... ");
      }
      sampleSA(this,verbose);
      if (verbose) {
        std::operator<<((ostream *)&std::cout,"  Done.\n");
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&mark_pos.super__Bvector_base<std::allocator<bool>_>);
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&char_inserted.super__Bvector_base<std::allocator<bool>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&alphabet.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n");
  exit(1);
}

Assistant:

IndexedBWT(string &BWT, ulint sample_rate, bool verbose=false){

		this->n=BWT.length();
		this->offrate=sample_rate;

		number_of_SA_pointers = (sample_rate==0?0:n/sample_rate + 1);

		if(verbose) cout << " Building indexed BWT data structure" << endl;
		if(verbose) cout << "  Number of sampled SA pointers = " << number_of_SA_pointers << endl;

		w = ceil(log2(n));
		if(w<1) w=1;

		ulint nr_of_terminators=0;

		//compute re-mapping to keep alphabet size to a minimum
		//from text chars -> to integers in {0,...,sigma}. the 0x0 byte is also remapped in 0x0, as the first alphabet character.
		remapping = vector<uchar>(256,0);

		//detect alphabet
		vector<uchar> alphabet;
		vector<bool> char_inserted = vector<bool>(256,false);

		for(ulint i=0;i<n;i++){

			if((uchar)BWT.at(i)==0){//found terminator. Save position
				terminator_position = i;
				nr_of_terminators++;
			}else{

				if(not char_inserted.at((uchar)BWT.at(i))){

					alphabet.push_back((uchar)BWT.at(i));
					char_inserted.at((uchar)BWT.at(i))=true;

				}

			}
		}

		if(nr_of_terminators!=1){

			cout << "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n";
			exit(1);

		}

		sigma = alphabet.size();

		//sort alphabet

		std::sort(alphabet.begin(),alphabet.end());

		//calculate remapping
		//note: remapping of terminator (0x0) is 0

		for(uint i=0;i<alphabet.size();i++)
			remapping[alphabet.at(i)] = i;

		//calculate inverse remapping

		inverse_remapping = vector<uchar>(sigma);

		for(uint i=0;i<sigma;i++)
			inverse_remapping[i] = alphabet.at(i);

		//apply remapping

		for(ulint i=0;i<n;i++)
			BWT.at(i) = remapping[(uchar)BWT.at(i)];

		bwt_wt =  WaveletTree(BWT,verbose);

		marked_positions =  succinct_bitvector();

		text_pointers =  packed_view_t(w,number_of_SA_pointers);

		log_sigma = bwt_wt.bitsPerSymbol();

		FIRST = vector<ulint>(256,0);

		FIRST[TERMINATOR]=0;//first occurrence of terminator char in the first column is at the beginning

		//count number of occurrences of each character
		for(ulint i=0;i<n;i++)
			if(i!=terminator_position)
				FIRST[bwt_wt.charAt(i)]++;

		for(uint i=1;i<255;i++)
			FIRST[i] += FIRST[i-1];

		for(int i=254;i>0;i--)
			FIRST[i] = FIRST[i-1];

		FIRST[0] = 0;

		for(uint i=0;i<255;i++)
			FIRST[i]++;

		//restore original values in BWT
		for(ulint i=0;i<n;i++)
			BWT.at(i) = inverse_remapping[(uchar)BWT.at(i)];

		BWT.at(terminator_position) = 0;

		if(sample_rate>0){
			if(verbose) cout << "\n  Marking positions containing a SA pointer ... ";

			vector<bool> mark_pos = markPositions(verbose);
			marked_positions = succinct_bitvector( mark_pos );

			if(verbose) cout << "  Done.\n";

			if(verbose) cout << "\n  Sampling SA pointers ... ";
			sampleSA(verbose);
			if(verbose) cout << "  Done.\n";
		}

	}